

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreateEntityReliablePdu.cpp
# Opt level: O0

bool __thiscall
DIS::CreateEntityReliablePdu::operator==(CreateEntityReliablePdu *this,CreateEntityReliablePdu *rhs)

{
  bool local_19;
  bool ivarsEqual;
  CreateEntityReliablePdu *rhs_local;
  CreateEntityReliablePdu *this_local;
  
  local_19 = SimulationManagementWithReliabilityFamilyPdu::operator==
                       (&this->super_SimulationManagementWithReliabilityFamilyPdu,
                        &rhs->super_SimulationManagementWithReliabilityFamilyPdu);
  if (this->_requiredReliabilityService != rhs->_requiredReliabilityService) {
    local_19 = false;
  }
  if (this->_pad1 != rhs->_pad1) {
    local_19 = false;
  }
  if (this->_pad2 != rhs->_pad2) {
    local_19 = false;
  }
  if (this->_requestID != rhs->_requestID) {
    local_19 = false;
  }
  return local_19;
}

Assistant:

bool CreateEntityReliablePdu::operator ==(const CreateEntityReliablePdu& rhs) const
 {
     bool ivarsEqual = true;

     ivarsEqual = SimulationManagementWithReliabilityFamilyPdu::operator==(rhs);

     if( ! (_requiredReliabilityService == rhs._requiredReliabilityService) ) ivarsEqual = false;
     if( ! (_pad1 == rhs._pad1) ) ivarsEqual = false;
     if( ! (_pad2 == rhs._pad2) ) ivarsEqual = false;
     if( ! (_requestID == rhs._requestID) ) ivarsEqual = false;

    return ivarsEqual;
 }